

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueRenderResource.h
# Opt level: O2

void __thiscall
Rml::UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
::ReleaseInDerived(UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                   *this)

{
  Mesh MStack_38;
  
  Rml::Geometry::Release((ReleaseMode)&MStack_38);
  Mesh::~Mesh(&MStack_38);
  return;
}

Assistant:

void MoveFrom(UniqueRenderResource& other) noexcept
	{
		render_manager = std::exchange(other.render_manager, nullptr);
		resource_handle = std::exchange(other.resource_handle, InvalidHandleValue);
	}